

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool __thiscall libcellml::Model::removeUnits(Model *this,UnitsPtr *units)

{
  shared_ptr<libcellml::Units> *psVar1;
  const_iterator __position;
  UnitsImpl *this_00;
  
  __position = ModelImpl::findUnits
                         ((ModelImpl *)
                          (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                          super_Entity.mPimpl,units);
  psVar1 = (shared_ptr<libcellml::Units> *)
           (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
           [4].mId.field_2._M_allocated_capacity;
  if (__position._M_current != psVar1) {
    this_00 = Units::pFunc((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    erase((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           *)&(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
              mPimpl[4].mId._M_string_length,__position);
  }
  return __position._M_current != psVar1;
}

Assistant:

bool Model::removeUnits(const UnitsPtr &units)
{
    bool status = false;
    auto result = pFunc()->findUnits(units);
    if (result != pFunc()->mUnits.end()) {
        units->pFunc()->removeParent();
        pFunc()->mUnits.erase(result);
        status = true;
    }

    return status;
}